

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

uint kj::_::lg(uint value)

{
  uint uVar1;
  uint value_local;
  
  uVar1 = 0x1f;
  if (value != 0) {
    for (; value >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return 0x1f - (uVar1 ^ 0x1f);
}

Assistant:

static inline uint lg(uint value) {
  // Compute floor(log2(value)).
  //
  // Undefined for value = 0.
#if _MSC_VER
  unsigned long i;
  auto found = _BitScanReverse(&i, value);
  KJ_DASSERT(found);  // !found means value = 0
  return i;
#else
  return sizeof(uint) * 8 - 1 - __builtin_clz(value);
#endif
}